

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fft.c
# Opt level: O1

int main(int argc,char **argv)

{
  kiss_fft_cfg cfg;
  int s;
  long lVar1;
  double dVar2;
  kiss_fft_cpx audio [22050];
  kiss_fft_cpx fft_out [22050];
  kiss_fft_cpx akStack_56238 [22050];
  kiss_fft_cpx akStack_2b128 [100];
  float fStack_2ae08;
  float fStack_2ae04;
  
  lVar1 = 0;
  do {
    dVar2 = sin((double)(int)lVar1 * 3.0303030303030302e-05 * 6283.185307179586);
    akStack_56238[lVar1].r = (float)(dVar2 * 3535.533905932738);
    akStack_56238[lVar1].i = 0.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x5622);
  cfg = kiss_fft_alloc(0xce4,0,(void *)0x0,(size_t *)0x0);
  kiss_fft(cfg,akStack_56238,akStack_2b128);
  dVar2 = (double)fStack_2ae08 * (double)fStack_2ae08 + (double)fStack_2ae04 * (double)fStack_2ae04;
  if (dVar2 < 0.0) {
    sqrt(dVar2);
  }
  free(cfg);
  sprintf(mu_message,"FFT result is wrong expected %.2f got %.2f ",0x40a3880000000000,
          (double)fStack_2ae08);
  tests_run = tests_run + 1;
  puts(mu_message);
  printf("Tests run: %d\n",(ulong)(uint)tests_run);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
     char *result = all_tests();
     if (result != 0) {
         printf("%s\n", result);
     }
     else {
         printf("ALL TESTS PASSED\n");
     }
     printf("Tests run: %d\n", tests_run);

     return result != 0;
}